

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int __thiscall options::parse(options *this,int argc,char **argv)

{
  _List_node_base *p_Var1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  reference pvVar5;
  reference pbVar6;
  size_type sVar7;
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  double dVar8;
  string i_3;
  iterator __end20;
  iterator __begin20;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range20;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items_2;
  string i_2;
  iterator __end18;
  iterator __begin18;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range18;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items_1;
  Compression compression;
  int c_1;
  string i_1;
  iterator __end13;
  iterator __begin13;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range13;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  int c;
  char *libraryVersion;
  int i;
  undefined5 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5d;
  undefined1 in_stack_fffffffffffffe5e;
  undefined1 in_stack_fffffffffffffe5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  ostream *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe74;
  undefined1 in_stack_fffffffffffffe75;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  ostream *in_stack_fffffffffffffe78;
  ostream *in_stack_fffffffffffffe80;
  string local_160 [32];
  string local_140 [7];
  bool verbose;
  iterator in_stack_fffffffffffffec8;
  ostream *in_stack_fffffffffffffed0;
  ostream local_128 [24];
  undefined4 local_110;
  undefined4 local_10c;
  undefined4 local_108;
  undefined4 local_104;
  string local_100 [32];
  _Self local_e0;
  _Self local_d8;
  undefined1 *local_d0;
  undefined1 local_c8 [24];
  undefined4 local_b0;
  undefined4 local_ac;
  int local_a8;
  Compression local_a4;
  int local_a0;
  int local_9c;
  undefined4 local_98;
  string local_88 [32];
  _Self local_68;
  _Self local_60;
  undefined1 *local_58;
  undefined1 local_50 [24];
  int local_38;
  int local_34;
  char *local_30;
  int local_24;
  long local_20;
  int local_14;
  int local_4;
  
  local_24 = 1;
  *(undefined4 *)(in_RDI + 6) = 7;
  local_20 = in_RDX;
  local_14 = in_ESI;
  if (in_ESI == 1) {
    verbose = SUB81((ulong)_local_140 >> 0x38,0);
    usageMessage(in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8._M_node,verbose);
    local_4 = 1;
  }
  else {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    while( true ) {
                      while( true ) {
                        if (local_14 <= local_24) {
                          sVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                                            ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                             (in_RDI + 1));
                          if (sVar7 == 0) {
                            std::operator<<((ostream *)&std::cerr,"Missing input file\n");
                            p_Var1 = _local_140;
                            verbose = SUB81((ulong)_local_140 >> 0x38,0);
                            bVar2 = verbose;
                            _local_140 = p_Var1;
                            usageMessage(in_stack_fffffffffffffed0,
                                         (char *)in_stack_fffffffffffffec8._M_node,bVar2);
                            return 1;
                          }
                          if ((((*(byte *)((long)in_RDI + 0x34) & 1) == 0) && ((int)in_RDI[6] == 0))
                             && (*in_RDI == 0)) {
                            std::operator<<((ostream *)&std::cerr,
                                            "Nothing to do: no output file specified, and all performance/size data disabled"
                                           );
                            std::operator<<((ostream *)&std::cerr,
                                            "Use -o to specify output image filename\n");
                            return 1;
                          }
                          sVar7 = std::vector<PixelMode,_std::allocator<PixelMode>_>::size
                                            ((vector<PixelMode,_std::allocator<PixelMode>_> *)
                                             (in_RDI + 7));
                          if (sVar7 == 0) {
                            std::vector<PixelMode,_std::allocator<PixelMode>_>::push_back
                                      ((vector<PixelMode,_std::allocator<PixelMode>_> *)
                                       in_stack_fffffffffffffe60,
                                       (value_type *)
                                       CONCAT17(in_stack_fffffffffffffe5f,
                                                CONCAT16(in_stack_fffffffffffffe5e,
                                                         CONCAT15(in_stack_fffffffffffffe5d,
                                                                  in_stack_fffffffffffffe58))));
                          }
                          sVar7 = std::
                                  vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                                  ::size((vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                                          *)(in_RDI + 10));
                          if (sVar7 == 0) {
                            std::vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                            ::push_back((vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                                         *)in_stack_fffffffffffffe60,
                                        (value_type *)
                                        CONCAT17(in_stack_fffffffffffffe5f,
                                                 CONCAT16(in_stack_fffffffffffffe5e,
                                                          CONCAT15(in_stack_fffffffffffffe5d,
                                                                   in_stack_fffffffffffffe58))));
                          }
                          return 0;
                        }
                        iVar3 = strcmp(*(char **)(local_20 + (long)local_24 * 8),"-h");
                        if ((iVar3 == 0) ||
                           (iVar3 = strcmp(*(char **)(local_20 + (long)local_24 * 8),"--help"),
                           iVar3 == 0)) {
                          p_Var1 = _local_140;
                          verbose = SUB81((ulong)_local_140 >> 0x38,0);
                          bVar2 = verbose;
                          _local_140 = p_Var1;
                          usageMessage(in_stack_fffffffffffffed0,
                                       (char *)in_stack_fffffffffffffec8._M_node,bVar2);
                          return 0;
                        }
                        iVar3 = strcmp(*(char **)(local_20 + (long)local_24 * 8),"--version");
                        if (iVar3 == 0) {
                          local_30 = (char *)Imf_3_4::getLibraryVersion();
                          poVar4 = std::operator<<((ostream *)&std::cout,"exrmetrics (OpenEXR) ");
                          std::operator<<(poVar4,"3.4.0");
                          iVar3 = strcmp(local_30,"3.4.0");
                          if (iVar3 != 0) {
                            poVar4 = std::operator<<((ostream *)&std::cout,"(OpenEXR version ");
                            poVar4 = std::operator<<(poVar4,local_30);
                            std::operator<<(poVar4,")");
                          }
                          poVar4 = std::operator<<((ostream *)&std::cout," https://openexr.com");
                          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                          poVar4 = std::operator<<((ostream *)&std::cout,
                                                                                                      
                                                  "Copyright (c) Contributors to the OpenEXR Project"
                                                  );
                          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                          poVar4 = std::operator<<((ostream *)&std::cout,"License BSD-3-Clause");
                          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                          return 0;
                        }
                        iVar3 = strcmp(*(char **)(local_20 + (long)local_24 * 8),"-m");
                        if (iVar3 != 0) break;
                        *(undefined4 *)((long)in_RDI + 0x24) = 0xffffffff;
                        local_24 = local_24 + 1;
                      }
                      iVar3 = strcmp(*(char **)(local_20 + (long)local_24 * 8),"-t");
                      if (iVar3 != 0) break;
                      if (local_14 + -2 < local_24) {
                        std::operator<<((ostream *)&std::cerr,
                                        "Missing thread count value with -t option\n");
                        return 1;
                      }
                      iVar3 = atoi(*(char **)(local_20 + (long)(local_24 + 1) * 8));
                      *(int *)((long)in_RDI + 0x24) = iVar3;
                      if (*(int *)((long)in_RDI + 0x24) < 0) {
                        poVar4 = std::operator<<((ostream *)&std::cerr,"bad thread count ");
                        poVar4 = std::operator<<(poVar4,*(char **)(local_20 +
                                                                  (long)(local_24 + 1) * 8));
                        std::operator<<(poVar4," specified to -t option\n");
                        return 1;
                      }
                      local_24 = local_24 + 2;
                    }
                    iVar3 = strcmp(*(char **)(local_20 + (long)local_24 * 8),"--bench");
                    if (iVar3 != 0) break;
                    std::vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>::clear
                              ((vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                                *)0x10a886);
                    for (local_34 = 0; local_34 < 10; local_34 = local_34 + 1) {
                      local_38 = local_34;
                      std::vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>::
                      push_back((vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                                 *)in_stack_fffffffffffffe60,
                                (value_type *)
                                CONCAT17(in_stack_fffffffffffffe5f,
                                         CONCAT16(in_stack_fffffffffffffe5e,
                                                  CONCAT15(in_stack_fffffffffffffe5d,
                                                           in_stack_fffffffffffffe58))));
                    }
                    *(undefined4 *)((long)in_RDI + 0x2c) = 10;
                    *(undefined1 *)((long)in_RDI + 0x34) = 0;
                    *(undefined1 *)((long)in_RDI + 0x36) = 1;
                    *(undefined4 *)(in_RDI + 4) = 0xffffffff;
                    *(undefined4 *)(in_RDI + 6) = 6;
                    std::vector<PixelMode,_std::allocator<PixelMode>_>::resize
                              ((vector<PixelMode,_std::allocator<PixelMode>_> *)
                               in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
                    pvVar5 = std::vector<PixelMode,_std::allocator<PixelMode>_>::operator[]
                                       ((vector<PixelMode,_std::allocator<PixelMode>_> *)
                                        (in_RDI + 7),0);
                    *pvVar5 = PIXELMODE_ALL_HALF;
                    pvVar5 = std::vector<PixelMode,_std::allocator<PixelMode>_>::operator[]
                                       ((vector<PixelMode,_std::allocator<PixelMode>_> *)
                                        (in_RDI + 7),1);
                    *pvVar5 = PIXELMODE_ALL_FLOAT;
                    local_24 = local_24 + 1;
                  }
                  iVar3 = strcmp(*(char **)(local_20 + (long)local_24 * 8),"--convert");
                  if (iVar3 != 0) break;
                  std::vector<PixelMode,_std::allocator<PixelMode>_>::resize
                            ((vector<PixelMode,_std::allocator<PixelMode>_> *)
                             in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
                  pvVar5 = std::vector<PixelMode,_std::allocator<PixelMode>_>::operator[]
                                     ((vector<PixelMode,_std::allocator<PixelMode>_> *)(in_RDI + 7),
                                      0);
                  *pvVar5 = PIXELMODE_ORIGINAL;
                  *(undefined4 *)((long)in_RDI + 0x2c) = 1;
                  *(undefined1 *)((long)in_RDI + 0x34) = 0;
                  *(undefined4 *)(in_RDI + 6) = 0;
                  *(undefined4 *)(in_RDI + 4) = 0xffffffff;
                  local_24 = local_24 + 1;
                }
                iVar3 = strcmp(*(char **)(local_20 + (long)local_24 * 8),"--passes");
                if (iVar3 != 0) break;
                if (local_14 + -2 < local_24) {
                  std::operator<<((ostream *)&std::cerr,
                                  "Missing pass count value with --passes option\n");
                  return 1;
                }
                iVar3 = atoi(*(char **)(local_20 + (long)(local_24 + 1) * 8));
                *(int *)((long)in_RDI + 0x2c) = iVar3;
                if (*(int *)((long)in_RDI + 0x2c) < 0) {
                  poVar4 = std::operator<<((ostream *)&std::cerr,"bad value for passes ");
                  poVar4 = std::operator<<(poVar4,*(char **)(local_20 + (long)(local_24 + 1) * 8));
                  std::operator<<(poVar4," specified to --passes option\n");
                  return 1;
                }
                local_24 = local_24 + 2;
              }
              iVar3 = strcmp(*(char **)(local_20 + (long)local_24 * 8),"-v");
              if (iVar3 != 0) break;
              *(undefined1 *)((long)in_RDI + 0x35) = 1;
              local_24 = local_24 + 1;
            }
            iVar3 = strcmp(*(char **)(local_20 + (long)local_24 * 8),"--csv");
            if (iVar3 != 0) break;
            *(undefined1 *)((long)in_RDI + 0x36) = 1;
            local_24 = local_24 + 1;
          }
          iVar3 = strcmp(*(char **)(local_20 + (long)local_24 * 8),"--json");
          if (iVar3 != 0) break;
          *(undefined1 *)((long)in_RDI + 0x36) = 0;
          local_24 = local_24 + 1;
        }
        iVar3 = strcmp(*(char **)(local_20 + (long)local_24 * 8),"-z");
        if ((iVar3 == 0) ||
           (iVar3 = strcmp(*(char **)(local_20 + (long)local_24 * 8),"--compression"), iVar3 == 0))
        break;
        iVar3 = strcmp(*(char **)(local_20 + (long)local_24 * 8),"-p");
        if (iVar3 == 0) {
          if (local_14 + -2 < local_24) {
            std::operator<<((ostream *)&std::cerr,"Missing part number with -p option\n");
            return 1;
          }
          iVar3 = strcmp(*(char **)(local_20 + (long)(local_24 + 1) * 8),"all");
          if (iVar3 == 0) {
            *(undefined4 *)(in_RDI + 4) = 0xffffffff;
          }
          else {
            iVar3 = atoi(*(char **)(local_20 + (long)(local_24 + 1) * 8));
            *(int *)(in_RDI + 4) = iVar3;
            if ((int)in_RDI[4] < -1) {
              poVar4 = std::operator<<((ostream *)&std::cerr,"bad part ");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)in_RDI[4]);
              std::operator<<(poVar4," specified to -p option\n");
              return 1;
            }
          }
          local_24 = local_24 + 2;
        }
        else {
          iVar3 = strcmp(*(char **)(local_20 + (long)local_24 * 8),"-l");
          if (iVar3 == 0) {
            if (local_14 + -2 < local_24) {
              std::operator<<((ostream *)&std::cerr,
                              "Missing compression level number with -l option\n");
              return 1;
            }
            dVar8 = atof(*(char **)(local_20 + (long)(local_24 + 1) * 8));
            *(float *)(in_RDI + 5) = (float)dVar8;
            if (*(float *)(in_RDI + 5) <= 0.0 && *(float *)(in_RDI + 5) != 0.0) {
              poVar4 = std::operator<<((ostream *)&std::cerr,"bad level ");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(float *)(in_RDI + 5));
              std::operator<<(poVar4," specified to -l option\n");
              return 1;
            }
            local_24 = local_24 + 2;
          }
          else {
            iVar3 = strcmp(*(char **)(local_20 + (long)local_24 * 8),"-o");
            if (iVar3 == 0) {
              if (local_14 + -2 < local_24) {
                std::operator<<((ostream *)&std::cerr,"Missing filename specified with -o\n");
                return 1;
              }
              if (*in_RDI != 0) {
                std::operator<<((ostream *)&std::cerr,
                                "-o output filename can only be specified once\n");
                return 1;
              }
              *in_RDI = *(long *)(local_20 + (long)(local_24 + 1) * 8);
              local_24 = local_24 + 2;
            }
            else {
              iVar3 = strcmp(*(char **)(local_20 + (long)local_24 * 8),"-16");
              if (iVar3 == 0) {
                if (local_14 + -2 < local_24) {
                  std::operator<<((ostream *)&std::cerr,"Missing mode with -16 option\n");
                  return 1;
                }
                iVar3 = strcmp(*(char **)(local_20 + (long)(local_24 + 1) * 8),"all");
                if (iVar3 == 0) {
                  local_ac = 1;
                  std::vector<PixelMode,_std::allocator<PixelMode>_>::push_back
                            ((vector<PixelMode,_std::allocator<PixelMode>_> *)
                             in_stack_fffffffffffffe60,
                             (value_type *)
                             CONCAT17(in_stack_fffffffffffffe5f,
                                      CONCAT16(in_stack_fffffffffffffe5e,
                                               CONCAT15(in_stack_fffffffffffffe5d,
                                                        in_stack_fffffffffffffe58))));
                }
                else {
                  iVar3 = strcmp(*(char **)(local_20 + (long)(local_24 + 1) * 8),"rgba");
                  if (iVar3 != 0) {
                    std::operator<<((ostream *)&std::cerr,
                                    " bad mode for -16 option: must be \'all\' or \'rgba\'\n");
                    return 1;
                  }
                  local_b0 = 3;
                  std::vector<PixelMode,_std::allocator<PixelMode>_>::push_back
                            ((vector<PixelMode,_std::allocator<PixelMode>_> *)
                             in_stack_fffffffffffffe60,
                             (value_type *)
                             CONCAT17(in_stack_fffffffffffffe5f,
                                      CONCAT16(in_stack_fffffffffffffe5e,
                                               CONCAT15(in_stack_fffffffffffffe5d,
                                                        in_stack_fffffffffffffe58))));
                }
                local_24 = local_24 + 2;
              }
              else {
                iVar3 = strcmp(*(char **)(local_20 + (long)local_24 * 8),"--pixelmode");
                if (iVar3 == 0) {
                  if (local_14 + -2 < local_24) {
                    std::operator<<((ostream *)&std::cerr,
                                    "Missing type list with  with --pixelmode option\n");
                    return 1;
                  }
                  split_abi_cxx11_((char *)__end20._M_node,i_3.field_2._M_local_buf[0xf]);
                  std::vector<PixelMode,_std::allocator<PixelMode>_>::clear
                            ((vector<PixelMode,_std::allocator<PixelMode>_> *)0x10b3c6);
                  local_d0 = local_c8;
                  local_d8._M_node =
                       (_List_node_base *)
                       std::__cxx11::
                       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffffe5f,
                                           CONCAT16(in_stack_fffffffffffffe5e,
                                                    CONCAT15(in_stack_fffffffffffffe5d,
                                                             in_stack_fffffffffffffe58))));
                  local_e0._M_node =
                       (_List_node_base *)
                       std::__cxx11::
                       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)CONCAT17(in_stack_fffffffffffffe5f,
                                         CONCAT16(in_stack_fffffffffffffe5e,
                                                  CONCAT15(in_stack_fffffffffffffe5d,
                                                           in_stack_fffffffffffffe58))));
                  while (bVar2 = std::operator!=(&local_d8,&local_e0), bVar2) {
                    pbVar6 = std::
                             _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator*((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)0x10b42b);
                    std::__cxx11::string::string(local_100,(string *)pbVar6);
                    in_stack_fffffffffffffe77 =
                         std::operator==(in_stack_fffffffffffffe60,
                                         (char *)CONCAT17(in_stack_fffffffffffffe5f,
                                                          CONCAT16(in_stack_fffffffffffffe5e,
                                                                   CONCAT15(
                                                  in_stack_fffffffffffffe5d,
                                                  in_stack_fffffffffffffe58))));
                    if ((bool)in_stack_fffffffffffffe77) {
                      local_104 = 1;
                      std::vector<PixelMode,_std::allocator<PixelMode>_>::push_back
                                ((vector<PixelMode,_std::allocator<PixelMode>_> *)
                                 in_stack_fffffffffffffe60,
                                 (value_type *)
                                 CONCAT17(in_stack_fffffffffffffe5f,
                                          CONCAT16(in_stack_fffffffffffffe5e,
                                                   CONCAT15(in_stack_fffffffffffffe5d,
                                                            in_stack_fffffffffffffe58))));
LAB_0010b631:
                      local_a8 = 0;
                    }
                    else {
                      in_stack_fffffffffffffe76 =
                           std::operator==(in_stack_fffffffffffffe60,
                                           (char *)CONCAT17(in_stack_fffffffffffffe5f,
                                                            CONCAT16(in_stack_fffffffffffffe5e,
                                                                     CONCAT15(
                                                  in_stack_fffffffffffffe5d,
                                                  in_stack_fffffffffffffe58))));
                      if ((bool)in_stack_fffffffffffffe76) {
                        local_108 = 2;
                        std::vector<PixelMode,_std::allocator<PixelMode>_>::push_back
                                  ((vector<PixelMode,_std::allocator<PixelMode>_> *)
                                   in_stack_fffffffffffffe60,
                                   (value_type *)
                                   CONCAT17(in_stack_fffffffffffffe5f,
                                            CONCAT16(in_stack_fffffffffffffe5e,
                                                     CONCAT15(in_stack_fffffffffffffe5d,
                                                              in_stack_fffffffffffffe58))));
                        goto LAB_0010b631;
                      }
                      in_stack_fffffffffffffe75 =
                           std::operator==(in_stack_fffffffffffffe60,
                                           (char *)CONCAT17(in_stack_fffffffffffffe5f,
                                                            CONCAT16(in_stack_fffffffffffffe5e,
                                                                     CONCAT15(
                                                  in_stack_fffffffffffffe5d,
                                                  in_stack_fffffffffffffe58))));
                      if (((bool)in_stack_fffffffffffffe75) ||
                         (in_stack_fffffffffffffe74 =
                               std::operator==(in_stack_fffffffffffffe60,
                                               (char *)CONCAT17(in_stack_fffffffffffffe5f,
                                                                CONCAT16(in_stack_fffffffffffffe5e,
                                                                         CONCAT15(
                                                  in_stack_fffffffffffffe5d,
                                                  in_stack_fffffffffffffe58)))),
                         (bool)in_stack_fffffffffffffe74)) {
                        local_10c = 3;
                        std::vector<PixelMode,_std::allocator<PixelMode>_>::push_back
                                  ((vector<PixelMode,_std::allocator<PixelMode>_> *)
                                   in_stack_fffffffffffffe60,
                                   (value_type *)
                                   CONCAT17(in_stack_fffffffffffffe5f,
                                            CONCAT16(in_stack_fffffffffffffe5e,
                                                     CONCAT15(in_stack_fffffffffffffe5d,
                                                              in_stack_fffffffffffffe58))));
                        goto LAB_0010b631;
                      }
                      bVar2 = std::operator==(in_stack_fffffffffffffe60,
                                              (char *)CONCAT17(in_stack_fffffffffffffe5f,
                                                               CONCAT16(in_stack_fffffffffffffe5e,
                                                                        CONCAT15(
                                                  in_stack_fffffffffffffe5d,
                                                  in_stack_fffffffffffffe58))));
                      in_stack_fffffffffffffe70 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe70);
                      if (bVar2) {
                        local_110 = 0;
                        std::vector<PixelMode,_std::allocator<PixelMode>_>::push_back
                                  ((vector<PixelMode,_std::allocator<PixelMode>_> *)
                                   in_stack_fffffffffffffe60,
                                   (value_type *)
                                   CONCAT17(in_stack_fffffffffffffe5f,
                                            CONCAT16(in_stack_fffffffffffffe5e,
                                                     CONCAT15(in_stack_fffffffffffffe5d,
                                                              in_stack_fffffffffffffe58))));
                        goto LAB_0010b631;
                      }
                      in_stack_fffffffffffffe68 =
                           std::operator<<((ostream *)&std::cerr,"bad pixel type ");
                      in_stack_fffffffffffffe60 =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           std::operator<<(in_stack_fffffffffffffe68,local_100);
                      std::operator<<((ostream *)in_stack_fffffffffffffe60,
                                      " for --pixelmode: must be half,float,rgba,mixed or orig\n");
                      local_4 = 1;
                      local_a8 = 1;
                    }
                    std::__cxx11::string::~string(local_100);
                    if (local_a8 != 0) goto LAB_0010b686;
                    std::
                    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator++(&local_d8);
                  }
                  local_24 = local_24 + 2;
                  local_a8 = 0;
LAB_0010b686:
                  std::__cxx11::
                  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x10b693);
                  if (local_a8 != 0) {
                    return local_4;
                  }
                }
                else {
                  iVar3 = strcmp(*(char **)(local_20 + (long)local_24 * 8),"--time");
                  if (iVar3 == 0) {
                    if (local_14 + -2 < local_24) {
                      std::operator<<((ostream *)&std::cerr,
                                      "Missing value list with --time option\n");
                      return 1;
                    }
                    *(undefined4 *)(in_RDI + 6) = 0;
                    iVar3 = strcmp(*(char **)(local_20 + (long)(local_24 + 1) * 8),"none");
                    if (iVar3 != 0) {
                      split_abi_cxx11_((char *)__end20._M_node,i_3.field_2._M_local_buf[0xf]);
                      in_stack_fffffffffffffed0 = local_128;
                      in_stack_fffffffffffffec8 =
                           std::__cxx11::
                           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)CONCAT17(in_stack_fffffffffffffe5f,
                                               CONCAT16(in_stack_fffffffffffffe5e,
                                                        CONCAT15(in_stack_fffffffffffffe5d,
                                                                 in_stack_fffffffffffffe58))));
                      _local_140 = std::__cxx11::
                                   list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)CONCAT17(in_stack_fffffffffffffe5f,
                                                     CONCAT16(in_stack_fffffffffffffe5e,
                                                              CONCAT15(in_stack_fffffffffffffe5d,
                                                                       in_stack_fffffffffffffe58))))
                      ;
                      while (bVar2 = std::operator!=((_Self *)&stack0xfffffffffffffec8,
                                                     (_Self *)(local_160 + 0x20)), bVar2) {
                        pbVar6 = std::
                                 _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ::operator*((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)0x10b7cf);
                        std::__cxx11::string::string(local_160,(string *)pbVar6);
                        in_stack_fffffffffffffe5f =
                             std::operator==(in_stack_fffffffffffffe60,
                                             (char *)CONCAT17(in_stack_fffffffffffffe5f,
                                                              CONCAT16(in_stack_fffffffffffffe5e,
                                                                       CONCAT15(
                                                  in_stack_fffffffffffffe5d,
                                                  in_stack_fffffffffffffe58))));
                        if ((bool)in_stack_fffffffffffffe5f) {
                          *(uint *)(in_RDI + 6) = *(uint *)(in_RDI + 6) | 1;
LAB_0010b8e1:
                          local_a8 = 0;
                        }
                        else {
                          in_stack_fffffffffffffe5e =
                               std::operator==(in_stack_fffffffffffffe60,
                                               (char *)CONCAT17(in_stack_fffffffffffffe5f,
                                                                CONCAT16(in_stack_fffffffffffffe5e,
                                                                         CONCAT15(
                                                  in_stack_fffffffffffffe5d,
                                                  in_stack_fffffffffffffe58))));
                          if ((bool)in_stack_fffffffffffffe5e) {
                            *(uint *)(in_RDI + 6) = *(uint *)(in_RDI + 6) | 4;
                            goto LAB_0010b8e1;
                          }
                          in_stack_fffffffffffffe5d =
                               std::operator==(in_stack_fffffffffffffe60,
                                               (char *)CONCAT17(in_stack_fffffffffffffe5f,
                                                                CONCAT16(in_stack_fffffffffffffe5e,
                                                                         CONCAT15(
                                                  in_stack_fffffffffffffe5d,
                                                  in_stack_fffffffffffffe58))));
                          if ((bool)in_stack_fffffffffffffe5d) {
                            *(uint *)(in_RDI + 6) = *(uint *)(in_RDI + 6) | 2;
                            goto LAB_0010b8e1;
                          }
                          std::operator<<((ostream *)&std::cerr,
                                          "bad value in timing list. Options are read,write,reread\n"
                                         );
                          local_4 = 1;
                          local_a8 = 1;
                        }
                        std::__cxx11::string::~string(local_160);
                        if (local_a8 != 0) goto LAB_0010b91f;
                        std::
                        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator++((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&stack0xfffffffffffffec8);
                      }
                      local_a8 = 0;
LAB_0010b91f:
                      std::__cxx11::
                      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)0x10b92c);
                      if (local_a8 != 0) {
                        return local_4;
                      }
                    }
                    local_24 = local_24 + 2;
                  }
                  else {
                    iVar3 = strcmp(*(char **)(local_20 + (long)local_24 * 8),"--no-size");
                    if (iVar3 == 0) {
                      *(undefined1 *)((long)in_RDI + 0x34) = 0;
                      local_24 = local_24 + 1;
                    }
                    else {
                      iVar3 = strcmp(*(char **)(local_20 + (long)local_24 * 8),"-i");
                      if (iVar3 == 0) {
                        if (local_14 + -2 < local_24) {
                          std::operator<<((ostream *)&std::cerr,"Missing filename with -i option\n")
                          ;
                          return 1;
                        }
                        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                   CONCAT17(in_stack_fffffffffffffe77,
                                            CONCAT16(in_stack_fffffffffffffe76,
                                                     CONCAT15(in_stack_fffffffffffffe75,
                                                              CONCAT14(in_stack_fffffffffffffe74,
                                                                       in_stack_fffffffffffffe70))))
                                   ,(value_type *)in_stack_fffffffffffffe68);
                        local_24 = local_24 + 2;
                      }
                      else {
                        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                   CONCAT17(in_stack_fffffffffffffe77,
                                            CONCAT16(in_stack_fffffffffffffe76,
                                                     CONCAT15(in_stack_fffffffffffffe75,
                                                              CONCAT14(in_stack_fffffffffffffe74,
                                                                       in_stack_fffffffffffffe70))))
                                   ,(value_type *)in_stack_fffffffffffffe68);
                        local_24 = local_24 + 1;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      std::vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>::clear
                ((vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_> *)0x10abf0);
      if (local_14 + -2 < local_24) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Missing compression value with ");
        poVar4 = std::operator<<(poVar4,*(char **)(local_20 + (long)local_24 * 8));
        std::operator<<(poVar4," option\n");
        return 1;
      }
      split_abi_cxx11_((char *)__end20._M_node,i_3.field_2._M_local_buf[0xf]);
      local_58 = local_50;
      local_60._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffe5f,
                               CONCAT16(in_stack_fffffffffffffe5e,
                                        CONCAT15(in_stack_fffffffffffffe5d,in_stack_fffffffffffffe58
                                                ))));
      local_68._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffe5f,
                             CONCAT16(in_stack_fffffffffffffe5e,
                                      CONCAT15(in_stack_fffffffffffffe5d,in_stack_fffffffffffffe58))
                            ));
      while (bVar2 = std::operator!=(&local_60,&local_68), bVar2) {
        pbVar6 = std::
                 _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)0x10ace3);
        std::__cxx11::string::string(local_88,(string *)pbVar6);
        bVar2 = std::operator==(in_stack_fffffffffffffe60,
                                (char *)CONCAT17(in_stack_fffffffffffffe5f,
                                                 CONCAT16(in_stack_fffffffffffffe5e,
                                                          CONCAT15(in_stack_fffffffffffffe5d,
                                                                   in_stack_fffffffffffffe58))));
        if (bVar2) {
          local_98 = 10;
          std::vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>::push_back
                    ((vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_> *)
                     in_stack_fffffffffffffe60,
                     (value_type *)
                     CONCAT17(in_stack_fffffffffffffe5f,
                              CONCAT16(in_stack_fffffffffffffe5e,
                                       CONCAT15(in_stack_fffffffffffffe5d,in_stack_fffffffffffffe58)
                                      )));
LAB_0010ae94:
          local_a8 = 0;
        }
        else {
          bVar2 = std::operator==(in_stack_fffffffffffffe60,
                                  (char *)CONCAT17(in_stack_fffffffffffffe5f,
                                                   CONCAT16(in_stack_fffffffffffffe5e,
                                                            CONCAT15(in_stack_fffffffffffffe5d,
                                                                     in_stack_fffffffffffffe58))));
          if (bVar2) {
            for (local_9c = 0; local_9c < 10; local_9c = local_9c + 1) {
              local_a0 = local_9c;
              std::vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>::push_back
                        ((vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_> *)
                         in_stack_fffffffffffffe60,
                         (value_type *)
                         CONCAT17(in_stack_fffffffffffffe5f,
                                  CONCAT16(in_stack_fffffffffffffe5e,
                                           CONCAT15(in_stack_fffffffffffffe5d,
                                                    in_stack_fffffffffffffe58))));
            }
            goto LAB_0010ae94;
          }
          Imf_3_4::getCompressionIdFromName(local_88,&local_a4);
          if (local_a4 != NUM_COMPRESSION_METHODS) {
            std::vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>::push_back
                      ((vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_> *)
                       CONCAT17(in_stack_fffffffffffffe77,
                                CONCAT16(in_stack_fffffffffffffe76,
                                         CONCAT15(in_stack_fffffffffffffe75,
                                                  CONCAT14(in_stack_fffffffffffffe74,
                                                           in_stack_fffffffffffffe70)))),
                       (value_type *)in_stack_fffffffffffffe68);
            goto LAB_0010ae94;
          }
          in_stack_fffffffffffffe80 =
               std::operator<<((ostream *)&std::cerr,"unknown compression type ");
          in_stack_fffffffffffffe78 = std::operator<<(in_stack_fffffffffffffe80,local_88);
          std::ostream::operator<<(in_stack_fffffffffffffe78,std::endl<char,std::char_traits<char>>)
          ;
          local_4 = 1;
          local_a8 = 1;
        }
        std::__cxx11::string::~string(local_88);
        if (local_a8 != 0) goto LAB_0010aee9;
        std::
        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_60);
      }
      local_24 = local_24 + 2;
      local_a8 = 0;
LAB_0010aee9:
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x10aef6);
    } while (local_a8 == 0);
  }
  return local_4;
}

Assistant:

int
options::parse (int argc, char* argv[])
{

    int i = 1;

    timing = TIME_READ | TIME_WRITE | TIME_REREAD;

    if (argc == 1)
    {
        usageMessage (cerr, "exrmetrics", true);
        return 1;
    }

    while (i < argc)
    {
        if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
        {
            usageMessage (cout, "exrmetrics", true);
            return 0;
        }

        else if (!strcmp (argv[i], "--version"))
        {
            const char* libraryVersion = getLibraryVersion ();

            cout << "exrmetrics (OpenEXR) " << OPENEXR_VERSION_STRING;
            if (strcmp (libraryVersion, OPENEXR_VERSION_STRING))
                cout << "(OpenEXR version " << libraryVersion << ")";
            cout << " https://openexr.com" << endl;
            cout << "Copyright (c) Contributors to the OpenEXR Project" << endl;
            cout << "License BSD-3-Clause" << endl;
            return 0;
        }
        else if (!strcmp (argv[i], "-m"))
        {
            threads = -1;
            i += 1;
        }
        else if (!strcmp (argv[i], "-t"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing thread count value with -t option\n";
                return 1;
            }

            threads = atoi (argv[i + 1]);
            if (threads < 0)
            {
                cerr << "bad thread count " << argv[i + 1]
                     << " specified to -t option\n";
                return 1;
            }

            i += 2;
        }
        else if (!strcmp (argv[i], "--bench"))
        {
            compressions.clear ();
            for (int c = 0; c < NUM_COMPRESSION_METHODS; ++c)
            {
                compressions.push_back (Compression (c));
            }
            passes         = 10;
            outputSizeData = false;
            csv            = true;
            part           = -1;
            timing         = TIME_WRITE | TIME_REREAD;
            pixelModes.resize (2);
            pixelModes[0] = PIXELMODE_ALL_HALF;
            pixelModes[1] = PIXELMODE_ALL_FLOAT;
            i += 1;
        }
        else if (!strcmp (argv[i], "--convert"))
        {
            pixelModes.resize (1);
            pixelModes[0]  = PIXELMODE_ORIGINAL;
            passes         = 1;
            outputSizeData = false;
            timing         = 0;
            part           = -1;
            i += 1;
        }
        else if (!strcmp (argv[i], "--passes"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing pass count value with --passes option\n";
                return 1;
            }
            passes = atoi (argv[i + 1]);
            if (passes < 0)
            {
                cerr << "bad value for passes " << argv[i + 1]
                     << " specified to --passes option\n";
                return 1;
            }
            i += 2;
        }
        else if (!strcmp (argv[i], "-v"))
        {
            verbose = true;
            i += 1;
        }
        else if (!strcmp (argv[i], "--csv"))
        {
            csv = true;
            i += 1;
        }
        else if (!strcmp (argv[i], "--json"))
        {
            csv = false;
            i += 1;
        }
        else if (!strcmp (argv[i], "-z") || !strcmp (argv[i], "--compression"))
        {
            compressions.clear ();
            if (i > argc - 2)
            {
                cerr << "Missing compression value with " << argv[i]
                     << " option\n";
                return 1;
            }
            std::list<string> items = split (argv[i + 1], ',');

            for (string i: items)
            {

                if (i == "orig")
                {
                    compressions.push_back (NUM_COMPRESSION_METHODS);
                }
                else if (i == "all")
                {
                    for (int c = 0; c < NUM_COMPRESSION_METHODS; ++c)
                    {
                        compressions.push_back (Compression (c));
                    }
                }
                else
                {
                    Compression compression;
                    getCompressionIdFromName (i, compression);
                    if (compression == Compression::NUM_COMPRESSION_METHODS)
                    {
                        cerr << "unknown compression type " << i << endl;
                        return 1;
                    }
                    compressions.push_back (compression);
                }
            }
            i += 2;
        }
        else if (!strcmp (argv[i], "-p"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing part number with -p option\n";
                return 1;
            }
            if (!strcmp (argv[i + 1], "all")) { part = -1; }
            else
            {
                part = atoi (argv[i + 1]);
                if (part < -1)
                {
                    cerr << "bad part " << part << " specified to -p option\n";
                    return 1;
                }
            }

            i += 2;
        }
        else if (!strcmp (argv[i], "-l"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing compression level number with -l option\n";
                return 1;
            }
            level = atof (argv[i + 1]);
            if (level < 0)
            {
                cerr << "bad level " << level << " specified to -l option\n";
                return 1;
            }

            i += 2;
        }
        else if (!strcmp (argv[i], "-o"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing filename specified with -o\n";
                return 1;
            }
            if (outFile)
            {
                cerr << "-o output filename can only be specified once\n";
                return 1;
            }
            outFile = argv[i + 1];
            i += 2;
        }
        // deprecated flag for backwards compatibility
        else if (!strcmp (argv[i], "-16"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing mode with -16 option\n";
                return 1;
            }
            if (!strcmp (argv[i + 1], "all"))
            {
                pixelModes.push_back (PIXELMODE_ALL_HALF);
            }
            else if (!strcmp (argv[i + 1], "rgba"))
            {
                pixelModes.push_back (PIXELMODE_MIXED_HALF_FLOAT);
            }
            else
            {
                cerr << " bad mode for -16 option: must be 'all' or 'rgba'\n";
                return 1;
            }
            i += 2;
        }
        else if (!strcmp (argv[i], "--pixelmode"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing type list with  with --pixelmode option\n";
                return 1;
            }
            std::list<string> items = split (argv[i + 1], ',');
            pixelModes.clear ();
            for (string i: items)
            {
                if (i == "half") { pixelModes.push_back (PIXELMODE_ALL_HALF); }
                else if (i == "float")
                {
                    pixelModes.push_back (PIXELMODE_ALL_FLOAT);
                }
                else if (i == "rgba" || i == "mixed")
                {
                    pixelModes.push_back (PIXELMODE_MIXED_HALF_FLOAT);
                }
                else if (i == "orig")
                {
                    pixelModes.push_back (PIXELMODE_ORIGINAL);
                }
                else
                {
                    cerr
                        << "bad pixel type " << i
                        << " for --pixelmode: must be half,float,rgba,mixed or orig\n";
                    return 1;
                }
            }
            i += 2;
        }
        else if (!strcmp (argv[i], "--time"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing value list with --time option\n";
                return 1;
            }

            timing = TIME_NONE;
            if (strcmp (argv[i + 1], "none"))
            {
                std::list<string> items = split (argv[i + 1], ',');
                for (string i: items)
                {
                    if (i == "read") { timing |= TIME_READ; }
                    else if (i == "reread") { timing |= TIME_REREAD; }
                    else if (i == "write") { timing |= TIME_WRITE; }
                    else
                    {
                        cerr
                            << "bad value in timing list. Options are read,write,reread\n";
                        return 1;
                    }
                }
            }
            i += 2;
        }
        else if (!strcmp (argv[i], "--no-size"))
        {
            outputSizeData = false;
            i += 1;
        }
        else if (!strcmp (argv[i], "-i"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing filename with -i option\n";
                return 1;
            }
            inFiles.push_back (argv[i + 1]);
            i += 2;
        }
        else
        {
            inFiles.push_back (argv[i]);
            i += 1;
        }
    }
    if (inFiles.size () == 0)
    {
        cerr << "Missing input file\n";
        usageMessage (cerr, "exrmetrics", false);
        return 1;
    }

    if (!outputSizeData && !timing && !outFile)
    {
        cerr
            << "Nothing to do: no output file specified, and all performance/size data disabled";
        cerr << "Use -o to specify output image filename\n";
        return 1;
    }

    // default options if none specified
    if (pixelModes.size () == 0) { pixelModes.push_back (PIXELMODE_ORIGINAL); }

    if (compressions.size () == 0)
    {
        compressions.push_back (NUM_COMPRESSION_METHODS);
    }

    return 0;
}